

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O3

void okim6295_set_clock(void *chip,UINT32 clock)

{
  uint uVar1;
  okim6295_state *info;
  
  if (clock == 0) {
    clock = *(uint *)((long)chip + 0xf4);
  }
  *(UINT32 *)((long)chip + 0xf0) = clock;
  if (*(code **)((long)chip + 0x108) != (code *)0x0) {
    uVar1 = 0x84;
    if (*(char *)((long)chip + 0xe8) == '\0') {
      uVar1 = 0xa5;
    }
    (**(code **)((long)chip + 0x108))
              (*(undefined8 *)((long)chip + 0x110),(ulong)clock / (ulong)uVar1,
               (ulong)clock % (ulong)uVar1);
    return;
  }
  return;
}

Assistant:

static void okim6295_set_clock(void *chip, UINT32 clock)
{
	okim6295_state *info = (okim6295_state *)chip;
	
	if (clock)
		info->master_clock = clock;	// set to parameter
	else
		info->master_clock = ReadLE32(info->clock_buffer);	// set to value from buffer
	if (info->SmpRateFunc != NULL)
		info->SmpRateFunc(info->SmpRateData, okim6295_get_rate(chip));
}